

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_standard_midi.cpp
# Opt level: O1

void midi_processor::process_standard_midi_track
               (const_iterator *it,const_iterator end,midi_container *p_out,bool is_gmf)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  byte bVar6;
  ulong p_timestamp;
  char cVar7;
  size_t p_data_count;
  uint uVar8;
  byte bVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  midi_track track;
  size_t local_e0;
  uint local_d4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  ulong local_b0;
  uint local_a4;
  ulong local_a0;
  midi_event local_98;
  midi_track local_58;
  undefined4 local_3c;
  midi_container *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,is_gmf);
  local_58.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = 0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = p_out;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c8,3);
  bVar9 = 0xff;
  local_e0 = 0;
  local_d4 = 0;
  p_timestamp = 0;
  uVar8 = 0;
  do {
    if (((uVar8 & 1) == 0) && (it->_M_current == end._M_current)) break;
    uVar4 = decode_delta(it,end);
    cVar7 = '\x02';
    local_a4 = uVar8;
    if (((uVar8 & 1) != 0) || (it->_M_current != end._M_current)) {
      uVar8 = -uVar4;
      if (0 < (int)uVar4) {
        uVar8 = uVar4;
      }
      if (uVar8 < 0xf4241) {
        uVar8 = uVar8 + (int)p_timestamp;
        p_timestamp = (ulong)uVar8;
        pbVar2 = it->_M_current;
        if (pbVar2 != end._M_current) {
          it->_M_current = pbVar2 + 1;
          bVar1 = *pbVar2;
          bVar6 = bVar1;
          if (-1 < (char)bVar1) {
            if (bVar9 == 0xff) goto LAB_00111363;
            *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = bVar1;
            bVar6 = bVar9;
          }
          uVar5 = (ulong)bVar6;
          uVar4 = (uint)bVar6;
          if (bVar6 < 0xf0) {
            if ((int)local_e0 != 0) {
              local_a0 = CONCAT44(local_a0._4_4_,uVar4);
              midi_event::midi_event
                        (&local_98,local_b0 & 0xffffffff,extended,0,
                         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_e0);
              midi_track::add_event(&local_58,&local_98);
              if (local_98.m_ext_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_98.m_ext_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_98.m_ext_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_d4 = (uint)local_b0;
              uVar5 = local_a0 & 0xffffffff;
            }
            bVar9 = bVar6;
            if (((byte)local_3c & ((uint)uVar5 & 0xfffffff0) == 0xe0) == 0) {
              if ((char)bVar1 < '\0') {
                pbVar2 = it->_M_current;
                cVar7 = '\x02';
                if (pbVar2 == end._M_current) goto LAB_00111449;
                it->_M_current = pbVar2 + 1;
                *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start = *pbVar2;
              }
              p_data_count = 1;
              bVar3 = true;
              if ((bVar6 & 0xe0 | 0x10) != 0xd0) {
                pbVar2 = it->_M_current;
                if (pbVar2 == end._M_current) {
                  bVar3 = false;
                }
                else {
                  it->_M_current = pbVar2 + 1;
                  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = *pbVar2;
                  p_data_count = 2;
                }
              }
              cVar7 = '\x02';
              if (bVar3) {
                midi_event::midi_event
                          (&local_98,p_timestamp,(int)(uVar5 >> 4) + ~extended,(uint)uVar5 & 0xf,
                           local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,p_data_count);
                midi_track::add_event(&local_58,&local_98);
                if (local_98.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_98.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_98.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_98.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                cVar7 = '\0';
                local_d4 = uVar8;
              }
              local_e0 = 0;
              if (bVar3) {
LAB_001118ee:
                cVar7 = '\0';
                bVar9 = bVar6;
              }
            }
            else {
              cVar7 = '\x03';
LAB_00111449:
              local_e0 = 0;
            }
          }
          else if (bVar6 == 0xff) {
            if ((int)local_e0 != 0) {
              midi_event::midi_event
                        (&local_98,local_b0 & 0xffffffff,extended,0,
                         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_e0);
              midi_track::add_event(&local_58,&local_98);
              if (local_98.m_ext_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_98.m_ext_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_98.m_ext_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_d4 = (uint)local_b0;
            }
            pbVar2 = it->_M_current;
            if (pbVar2 != end._M_current) {
              it->_M_current = pbVar2 + 1;
              cVar7 = '\x02';
              if (pbVar2 + 1 != end._M_current) {
                bVar1 = *pbVar2;
                uVar8 = decode_delta(it,end);
                if ((-1 < (int)uVar8) &&
                   (uVar5 = (ulong)uVar8, (long)uVar5 <= (long)end._M_current - (long)it->_M_current
                   )) {
                  local_a0 = (ulong)(uVar8 + 2);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_c8,local_a0);
                  *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = 0xff;
                  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = bVar1;
                  if (uVar8 != 0) {
                    memmove(local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 2,it->_M_current,uVar5);
                  }
                  it->_M_current = it->_M_current + uVar5;
                  if (bVar1 == 0x2f) {
                    p_timestamp = (ulong)local_d4;
                  }
                  midi_event::midi_event
                            (&local_98,p_timestamp,extended,0,
                             local_c8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,local_a0);
                  midi_track::add_event(&local_58,&local_98);
                  if (local_98.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_98.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_98.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_98.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  local_a4 = local_a4 & 0xff;
                  if (bVar1 == 0x2f) {
                    local_a4 = 1;
                  }
                  cVar7 = (bVar1 == 0x2f) * '\x02';
                  local_d4 = (uint)p_timestamp;
                }
              }
              local_e0 = 0;
              bVar6 = bVar9;
              if (cVar7 != '\0') goto LAB_00111363;
              goto LAB_001118ee;
            }
LAB_0011179f:
            local_e0 = 0;
          }
          else if (uVar4 == 0xf7) {
            if ((int)local_e0 == 0) goto LAB_0011179f;
            if (it->_M_current != end._M_current) {
              uVar8 = decode_delta(it,end);
              uVar5 = (ulong)uVar8;
              cVar7 = '\x02';
              if (((int)uVar8 < 0) ||
                 (local_a0 = uVar5, (long)end._M_current - (long)it->_M_current < (long)uVar5)) {
                bVar3 = false;
              }
              else {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_c8,(ulong)(uVar8 + (int)local_e0));
                uVar5 = local_a0;
                if (uVar8 != 0) {
                  memmove(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_e0,it->_M_current,
                          local_a0);
                }
                it->_M_current = it->_M_current + uVar5;
                cVar7 = '\0';
                bVar3 = true;
                local_e0 = (ulong)(uVar8 + (int)local_e0);
              }
              goto LAB_001118e6;
            }
          }
          else if (uVar4 == 0xf0) {
            if ((int)local_e0 != 0) {
              midi_event::midi_event
                        (&local_98,local_b0 & 0xffffffff,extended,0,
                         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_e0);
              midi_track::add_event(&local_58,&local_98);
              if (local_98.m_ext_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_98.m_ext_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_98.m_ext_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_98.m_ext_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_d4 = (uint)local_b0;
            }
            if (it->_M_current == end._M_current) goto LAB_0011179f;
            uVar8 = decode_delta(it,end);
            cVar7 = '\x02';
            if ((int)uVar8 < 0) {
              bVar3 = false;
              local_e0 = 0;
            }
            else {
              uVar5 = (ulong)uVar8;
              bVar3 = false;
              local_e0 = 0;
              if ((long)uVar5 <= (long)end._M_current - (long)it->_M_current) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_c8,(ulong)(uVar8 + 1));
                *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start = 0xf0;
                if (uVar8 != 0) {
                  memmove(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1,it->_M_current,uVar5);
                }
                it->_M_current = it->_M_current + uVar5;
                cVar7 = '\0';
                bVar3 = true;
                local_e0 = (ulong)(uVar8 + 1);
                local_b0 = p_timestamp;
              }
            }
LAB_001118e6:
            bVar6 = bVar9;
            if (bVar3) goto LAB_001118ee;
          }
          else if (0xf7 < bVar6) {
            *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = bVar6;
            midi_event::midi_event
                      (&local_98,p_timestamp,extended,0,
                       local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,1);
            midi_track::add_event(&local_58,&local_98);
            local_d4 = uVar8;
            bVar6 = bVar9;
            if (local_98.m_ext_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_001118ee;
          }
        }
      }
    }
LAB_00111363:
    uVar8 = local_a4;
  } while (cVar7 != '\x02');
  if ((uVar8 & 1) == 0) {
    *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = 0xff;
    local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0x2f;
    midi_event::midi_event
              (&local_98,(ulong)local_d4,extended,0,
               local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,2);
    midi_track::add_event(&local_58,&local_98);
    if (local_98.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.m_ext_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  midi_container::add_track(local_38,&local_58);
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_58.m_events);
  return;
}

Assistant:

void midi_processor::process_standard_midi_track( std::vector<uint8_t>::const_iterator & it, std::vector<uint8_t>::const_iterator end, midi_container & p_out, bool is_gmf )
{
    bool needs_end_marker = false;

    midi_track track;
    unsigned current_timestamp = 0;
    unsigned last_event_timestamp = 0;
    unsigned char last_event_code = 0xFF;

    unsigned last_sysex_length = 0;
    unsigned last_sysex_timestamp = 0;

    std::vector<uint8_t> buffer;
    buffer.resize( 3 );

    for (;;)
    {
        if ( !needs_end_marker && it == end ) break;
        int delta = decode_delta( it, end );
        if ( !needs_end_marker && it == end ) break;

        if ( delta < 0 )
        {
            /*"MIDI processor encountered negative delta: " << delta << "; flipping sign.";*/
            delta = -delta;
        }
        
        if ( delta > 1000000 )
            break;

        current_timestamp += delta;
        if ( it == end ) break;
        unsigned char event_code = *it++;
        unsigned data_bytes_read = 0;
        if ( event_code < 0x80 )
        {
            if ( last_event_code == 0xFF ) break; /*throw exception_io_data("First MIDI track event short encoded");*/
            buffer[ data_bytes_read++ ] = event_code;
            event_code = last_event_code;
        }
        if ( event_code < 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            last_event_code = event_code;
            if ( is_gmf && ( event_code & 0xF0 ) == 0xE0 ) continue;
            if ( data_bytes_read < 1 )
            {
                if ( it == end ) break;
                buffer[ 0 ] = *it++;
                ++data_bytes_read;
            }
            bool command_valid = true;
            switch ( event_code & 0xF0 )
            {
            case 0xC0:
            case 0xD0:
                break;
            default:
                if ( it == end )
                {
                    command_valid = false;
                    break;
                }
                buffer[ data_bytes_read ] = *it++;
                ++data_bytes_read;
            }
            if ( !command_valid ) break;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, (midi_event::event_type)(( event_code >> 4 ) - 8), event_code & 0x0F, &buffer[0], data_bytes_read ) );
        }
        else if ( event_code == 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid System Exclusive message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 1 );
            buffer[ 0 ] = 0xF0;
            std::copy( it, it + data_count, buffer.begin() + 1 );
            it += data_count;
            last_sysex_length = data_count + 1;
            last_sysex_timestamp = current_timestamp;
        }
        else if ( event_code == 0xF7 ) // SysEx continuation
        {
            if ( !last_sysex_length ) break;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break;
            if ( end - it < data_count ) break;
            buffer.resize( last_sysex_length + data_count );
            std::copy( it, it + data_count, buffer.begin() + last_sysex_length );
            it += data_count;
            last_sysex_length += data_count;
        }
        else if ( event_code == 0xFF )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            unsigned char meta_type = *it++;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid meta message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 2 );
            buffer[ 0 ] = 0xFF;
            buffer[ 1 ] = meta_type;
            std::copy( it, it + data_count, buffer.begin() + 2 );
            it += data_count;
            if ( meta_type == 0x2F )
                current_timestamp = last_event_timestamp;
            else
                last_event_timestamp = current_timestamp;
            track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], data_count + 2 ) );

            if ( meta_type == 0x2F )
            {
                needs_end_marker = true;
                break;
            }
        }
        else if ( event_code >= 0xF8 && event_code <= 0xFE )
        {
            /* Sequencer specific events, single byte */
            buffer[ 0 ] = event_code;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, midi_event::extended, 0, &buffer[0], 1 ) );
        }
        else break; /*throw exception_io_data("Unhandled MIDI status code");*/
    }

    if ( !needs_end_marker )
    {
        buffer[ 0 ] = 0xFF;
        buffer[ 1 ] = 0x2F;
        track.add_event( midi_event( last_event_timestamp, midi_event::extended, 0, &buffer[0], 2 ) );
    }

    p_out.add_track( track );
}